

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

float Quat4f::dot(Quat4f *q0,Quat4f *q1)

{
  undefined1 auVar1 [16];
  Quat4f *in_RSI;
  Quat4f *in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  fVar2 = w(in_RDI);
  fVar3 = w(in_RSI);
  fVar4 = x(in_RDI);
  fVar5 = x(in_RSI);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)fVar2),ZEXT416((uint)(fVar4 * fVar5)))
  ;
  fVar2 = y(in_RDI);
  auVar6._0_4_ = y(in_RSI);
  auVar6._4_60_ = extraout_var;
  auVar1 = vfmadd213ss_fma(auVar6._0_16_,ZEXT416((uint)fVar2),ZEXT416(auVar1._0_4_));
  fVar2 = z(in_RDI);
  auVar7._0_4_ = z(in_RSI);
  auVar7._4_60_ = extraout_var_00;
  auVar1 = vfmadd213ss_fma(auVar7._0_16_,ZEXT416((uint)fVar2),ZEXT416(auVar1._0_4_));
  return auVar1._0_4_;
}

Assistant:

float Quat4f::dot( const Quat4f& q0, const Quat4f& q1 )
{
	return
	(
		q0.w() * q1.w() +
		q0.x() * q1.x() +
		q0.y() * q1.y() +
		q0.z() * q1.z()
	);
}